

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

int __thiscall glu::ShaderProgram::init(ShaderProgram *this,EVP_PKEY_CTX *ctx)

{
  Program *this_00;
  long *plVar1;
  uint shader;
  pointer ppSVar2;
  byte bVar3;
  int iVar4;
  Shader *this_01;
  long lVar5;
  int ndx;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  int shaderNdx_1;
  long lVar6;
  int shaderType_1;
  long lVar7;
  int shaderNdx;
  int shaderType;
  vector<glu::Shader*,std::allocator<glu::Shader*>> *this_02;
  undefined8 *puVar8;
  int length;
  long local_68;
  Shader *local_60;
  char *source;
  pointer local_50;
  char *local_40;
  Functions *local_38;
  
  bVar3 = 1;
  lVar5 = 0;
  local_40 = in_RDX;
  local_38 = (Functions *)ctx;
  while (lVar5 != 6) {
    plVar1 = (long *)(local_40 + lVar5 * 0x18);
    this_02 = (vector<glu::Shader*,std::allocator<glu::Shader*>> *)(this->m_shaders + lVar5);
    lVar7 = 8;
    lVar6 = 0;
    local_68 = lVar5;
    while( true ) {
      lVar5 = *plVar1;
      if ((int)((ulong)(plVar1[1] - lVar5) >> 5) <= lVar6) break;
      source = *(char **)(lVar5 + -8 + lVar7);
      length = *(int *)(lVar5 + lVar7);
      std::vector<glu::Shader_*,_std::allocator<glu::Shader_*>_>::reserve
                ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)this_02,
                 (*(long *)(this_02 + 8) - *(long *)this_02 >> 3) + 1);
      this_01 = (Shader *)operator_new(0x68);
      Shader::Shader(this_01,local_38,(ShaderType)local_68);
      local_60 = this_01;
      std::vector<glu::Shader*,std::allocator<glu::Shader*>>::emplace_back<glu::Shader*>
                (this_02,&local_60);
      ctx = (EVP_PKEY_CTX *)0x1;
      Shader::setSources(*(Shader **)(*(long *)(this_02 + 8) + -8),1,&source,&length);
      Shader::compile(*(Shader **)(*(long *)(this_02 + 8) + -8));
      if ((bVar3 & 1) == 0) {
        bVar3 = 0;
      }
      else {
        bVar3 = *(byte *)(*(long *)(*(long *)(this_02 + 8) + -8) + 0x58);
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x20;
      in_RDX = extraout_RDX;
    }
    lVar5 = local_68 + 1;
  }
  iVar4 = 6;
  if ((bVar3 & 1) != 0) {
    this_00 = &this->m_program;
    for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
      lVar7 = 0;
      while( true ) {
        ppSVar2 = this->m_shaders[lVar5].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)this->m_shaders[lVar5].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2) >> 3) <=
            lVar7) break;
        shader = ppSVar2[lVar7]->m_shader;
        ctx = (EVP_PKEY_CTX *)(ulong)shader;
        Program::attachShader(this_00,shader);
        lVar7 = lVar7 + 1;
        in_RDX = extraout_RDX_00;
      }
    }
    for (puVar8 = *(undefined8 **)(local_40 + 0x90); puVar8 != *(undefined8 **)(local_40 + 0x98);
        puVar8 = puVar8 + 5) {
      ctx = (EVP_PKEY_CTX *)(ulong)*(uint *)(puVar8 + 4);
      Program::bindAttribLocation(this_00,*(uint *)(puVar8 + 4),(char *)*puVar8);
      in_RDX = extraout_RDX_01;
    }
    if (*(int *)(local_40 + 0xa8) != 0) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)&source,
                 *(long *)(local_40 + 0xb8) - *(long *)(local_40 + 0xb0) >> 5,
                 (allocator_type *)&local_60);
      lVar5 = 0;
      lVar7 = 0;
      while( true ) {
        ctx = (EVP_PKEY_CTX *)((ulong)((long)local_50 - (long)source) >> 3);
        if ((int)ctx <= lVar7) break;
        *(undefined8 *)(source + lVar5) = *(undefined8 *)(*(long *)(local_40 + 0xb0) + lVar5 * 4);
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 8;
      }
      Program::transformFeedbackVaryings
                (this_00,(int)ctx,(char **)source,*(deUint32 *)(local_40 + 0xa8));
      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&source);
      in_RDX = extraout_RDX_02;
    }
    if (local_40[200] == '\x01') {
      ctx = (EVP_PKEY_CTX *)0x1;
      Program::setSeparable(this_00,true);
      in_RDX = extraout_RDX_03;
    }
    iVar4 = Program::link(this_00,(char *)ctx,in_RDX);
  }
  return iVar4;
}

Assistant:

void ShaderProgram::init (const glw::Functions& gl, const ProgramSources& sources)
{
	try
	{
		bool shadersOk = true;

		for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
		{
			for (int shaderNdx = 0; shaderNdx < (int)sources.sources[shaderType].size(); ++shaderNdx)
			{
				const char* source	= sources.sources[shaderType][shaderNdx].c_str();
				const int	length	= (int)sources.sources[shaderType][shaderNdx].size();

				m_shaders[shaderType].reserve(m_shaders[shaderType].size() + 1);

				m_shaders[shaderType].push_back(new Shader(gl, ShaderType(shaderType)));
				m_shaders[shaderType].back()->setSources(1, &source, &length);
				m_shaders[shaderType].back()->compile();

				shadersOk = shadersOk && m_shaders[shaderType].back()->getCompileStatus();
			}
		}

		if (shadersOk)
		{
			for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
				for (int shaderNdx = 0; shaderNdx < (int)m_shaders[shaderType].size(); ++shaderNdx)
					m_program.attachShader(m_shaders[shaderType][shaderNdx]->getShader());

			for (std::vector<AttribLocationBinding>::const_iterator binding = sources.attribLocationBindings.begin(); binding != sources.attribLocationBindings.end(); ++binding)
				m_program.bindAttribLocation(binding->location, binding->name.c_str());

			DE_ASSERT((sources.transformFeedbackBufferMode == GL_NONE) == sources.transformFeedbackVaryings.empty());
			if (sources.transformFeedbackBufferMode != GL_NONE)
			{
				std::vector<const char*> tfVaryings(sources.transformFeedbackVaryings.size());
				for (int ndx = 0; ndx < (int)tfVaryings.size(); ndx++)
					tfVaryings[ndx] = sources.transformFeedbackVaryings[ndx].c_str();

				m_program.transformFeedbackVaryings((int)tfVaryings.size(), &tfVaryings[0], sources.transformFeedbackBufferMode);
			}

			if (sources.separable)
				m_program.setSeparable(true);

			m_program.link();
		}
	}
	catch (...)
	{
		for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
			for (int shaderNdx = 0; shaderNdx < (int)m_shaders[shaderType].size(); ++shaderNdx)
				delete m_shaders[shaderType][shaderNdx];
		throw;
	}
}